

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  SourceLineInfo _lineInfo;
  bool bVar1;
  byte bVar2;
  ReusableStringStream *this_00;
  ReusableStringStream *this_01;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagAlias>_>::value,_pair<iterator,_bool>_>
  _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  *in_stack_fffffffffffffdc0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  *in_stack_fffffffffffffdc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  bool local_1a2;
  string local_178 [32];
  domain_error local_158 [16];
  _Base_ptr local_148;
  byte local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  _Base_ptr local_a8;
  byte local_a0;
  string local_88 [32];
  domain_error local_68 [39];
  allocator local_41;
  string local_40 [32];
  undefined8 *local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"[@",&local_41);
  bVar1 = startsWith(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_1a2 = false;
  if (bVar1) {
    local_1a2 = endsWith(&in_stack_fffffffffffffdc0->first,
                         (char)((ulong)in_stack_fffffffffffffdb8 >> 0x38));
  }
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (((local_1a2 ^ 0xffU) & 1) != 0) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdc0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [20])in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [37])in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (SourceLineInfo *)in_stack_fffffffffffffdb8);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffdb8);
    std::domain_error::domain_error(local_68,local_88);
    throw_exception<std::domain_error>((domain_error *)in_stack_fffffffffffffdc0);
  }
  local_138 = *local_20;
  uStack_130 = local_20[1];
  _lineInfo.line = (size_t)in_stack_fffffffffffffdd0;
  _lineInfo.file = (char *)in_stack_fffffffffffffdc8;
  TagAlias::TagAlias((TagAlias *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,_lineInfo);
  std::make_pair<std::__cxx11::string_const&,Catch::TagAlias>
            (&in_stack_fffffffffffffdc8->first,(TagAlias *)in_stack_fffffffffffffdc0);
  _Var3 = std::
          map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::insert<std::pair<std::__cxx11::string,Catch::TagAlias>>
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_148 = (_Base_ptr)_Var3.first._M_node;
  local_140 = _Var3.second;
  bVar2 = local_140 ^ 0xff;
  local_a8 = local_148;
  local_a0 = local_140;
  clara::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  ::~pair(in_stack_fffffffffffffdc0);
  TagAlias::~TagAlias((TagAlias *)0x12c29f);
  if ((bVar2 & 1) != 0) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdc0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [20])in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [23])in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [17])in_stack_fffffffffffffdb8);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_10);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (SourceLineInfo *)in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [2])in_stack_fffffffffffffdb8);
    this_00 = ReusableStringStream::operator<<
                        ((ReusableStringStream *)in_stack_fffffffffffffdc0,
                         (char (*) [16])in_stack_fffffffffffffdb8);
    this_01 = ReusableStringStream::operator<<(this_00,(SourceLineInfo *)in_stack_fffffffffffffdb8);
    ReusableStringStream::str_abi_cxx11_(this_01);
    std::domain_error::domain_error(local_158,local_178);
    throw_exception<std::domain_error>((domain_error *)this_00);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }